

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O0

void demo_image(void)

{
  ostream *poVar1;
  double __x;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  double local_260;
  double z;
  double y;
  double x;
  undefined1 local_240 [4];
  int i;
  vector<double,_std::allocator<double>_> row;
  undefined1 local_220 [4];
  int j;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  image;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  Gnuplot gp;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
  gnuplotio::Gnuplot::Gnuplot((Gnuplot *)local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_220);
  for (row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 100;
      row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_240);
    for (x._4_4_ = 0; x._4_4_ < 100; x._4_4_ = x._4_4_ + 1) {
      y = ((double)x._4_4_ - 50.0) / 5.0;
      z = ((double)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ - 50.0) / 5.0;
      __x = sqrt(y * y + z * z);
      local_260 = cos(__x);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_240,&local_260);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_220,(value_type *)local_240);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_240);
  }
  poVar1 = std::operator<<((ostream *)local_1d0,"plot \'-\' binary");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"array",&local_2a1);
  gnuplotio::Gnuplot::
  binFmt2d<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (&local_280,(Gnuplot *)local_1d0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_220,&local_2a0);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  std::operator<<(poVar1,"with image\n");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  gnuplotio::Gnuplot::
  sendBinary2d<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            ((Gnuplot *)local_1d0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_220);
  pause_if_needed();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_220);
  gnuplotio::Gnuplot::~Gnuplot((Gnuplot *)local_1d0);
  return;
}

Assistant:

void demo_image() {
    // Example of plotting an image.  Of course you are free (and encouraged) to
    // use Blitz or Armadillo rather than std::vector in these situations.

    Gnuplot gp;

    std::vector<std::vector<double>> image;
    for(int j=0; j<100; j++) {
        std::vector<double> row;
        for(int i=0; i<100; i++) {
            double x = (i-50.0)/5.0;
            double y = (j-50.0)/5.0;
            double z = std::cos(sqrt(x*x+y*y));
            row.push_back(z);
        }
        image.push_back(row);
    }

    // It may seem counterintuitive that send1d should be used rather than
    // send2d.  The explanation is as follows.  The "send2d" method puts each
    // value on its own line, with blank lines between rows.  This is what is
    // expected by the splot command.  The two "dimensions" here are the lines
    // and the blank-line-delimited blocks.  The "send1d" method doesn't group
    // things into blocks.  So the elements of each row are printed as columns,
    // as expected by Gnuplot's "matrix with image" command.  But images
    // typically have lots of pixels, so sending as text is not the most
    // efficient (although, it's not really that bad in the case of this
    // example).  See the binary version below.
    //
    //gp << "plot '-' matrix with image\n";
    //gp.send1d(image);

    // To be honest, Gnuplot's documentation for "binary" and for "image" are
    // both unclear to me.  The following example comes by trial-and-error.
    gp << "plot '-' binary" << gp.binFmt2d(image, "array") << "with image\n";
    gp.sendBinary2d(image);

    pause_if_needed();
}